

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_3,_1,_false>::Block
          (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false> *this,
          Matrix<double,__1,__1,_0,__1,__1> *xpr,Index startRow,Index startCol)

{
  long lVar1;
  
  lVar1 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  (this->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>,_0>.m_data =
       (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
       startRow + lVar1 * startCol;
  (this->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_true>.m_xpr = xpr;
  (this->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_true>.m_startRow.
  m_value = startRow;
  (this->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_true>.m_startCol.
  m_value = startCol;
  (this->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_Eigen::Dense>).
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false,_true>.m_outerStride =
       lVar1;
  if ((((-1 < startRow) && (-1 < startCol)) && (startRow + 3 <= lVar1)) &&
     (startCol <
      (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols)) {
    return;
  }
  __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x85,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

BlockImpl_dense(XprType& xpr, Index startRow, Index startCol)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol)),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }